

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

String * __thiscall
capnp::compiler::ValueTranslator::makeNodeName
          (String *__return_storage_ptr__,ValueTranslator *this,Schema schema)

{
  uint32_t uVar1;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  undefined1 local_50 [8];
  Reader proto;
  ValueTranslator *this_local;
  Schema schema_local;
  
  proto._reader._40_8_ = this;
  this_local = (ValueTranslator *)schema.raw;
  schema_local.raw = (RawBrandedSchema *)__return_storage_ptr__;
  Schema::getProto((Reader *)local_50,(Schema *)&this_local);
  local_70 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_50);
  uVar1 = capnp::schema::Node::Reader::getDisplayNamePrefixLength((Reader *)local_50);
  local_60 = (ArrayPtr<const_char>)kj::StringPtr::slice((StringPtr *)&local_70,(ulong)uVar1);
  kj::str<kj::StringPtr>(__return_storage_ptr__,(StringPtr *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

kj::String ValueTranslator::makeNodeName(Schema schema) {
  schema::Node::Reader proto = schema.getProto();
  return kj::str(proto.getDisplayName().slice(proto.getDisplayNamePrefixLength()));
}